

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# external.cpp
# Opt level: O3

int __thiscall CaDiCaL::External::lookahead(External *this)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  
  if (this->extended == true) {
    this->extended = false;
  }
  update_molten_literals(this);
  uVar3 = Internal::lookahead(this->internal);
  if ((uVar3 & 0x7fffffff) == 0) {
    iVar4 = 0;
  }
  else {
    uVar2 = -uVar3;
    if (0 < (int)uVar3) {
      uVar2 = uVar3;
    }
    iVar1 = (this->internal->i2e).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start[uVar2];
    iVar4 = -iVar1;
    if (-1 < (int)uVar3) {
      iVar4 = iVar1;
    }
  }
  return iVar4;
}

Assistant:

int External::lookahead () {
  reset_extended ();
  update_molten_literals ();
  int ilit = internal->lookahead ();
  const int elit =
      (ilit && ilit != INT_MIN) ? internal->externalize (ilit) : 0;
  LOG ("lookahead internal %d external %d", ilit, elit);
  return elit;
}